

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

bool __thiscall QObject::isSignalConnected(QObject *this,QMetaMethod *signal)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  QObjectPrivate *this_00;
  long *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  uint signalIndex;
  QObjectPrivate *d;
  QMutexLocker<QBasicMutex> locker;
  QMetaMethod *in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 in_stack_ffffffffffffffc3;
  bool local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QObject *)0x3f00af);
  if (*in_RSI == 0) {
    local_19 = false;
  }
  else {
    iVar2 = QMetaMethod::relativeMethodIndex(in_stack_ffffffffffffff98);
    uVar3 = QMetaMethod::Data::flags((Data *)(in_RSI + 1));
    if ((uVar3 & 0x20) != 0) {
      iVar2 = QMetaObjectPrivate::originalClone((QMetaObject *)in_stack_ffffffffffffff98,0);
    }
    iVar4 = QMetaObjectPrivate::signalOffset
                      ((QMetaObject *)
                       CONCAT17(in_stack_ffffffffffffffa7,
                                CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
    uVar3 = iVar2 + iVar4;
    signalSlotLock(in_RDI);
    QMutexLocker<QBasicMutex>::QMutexLocker
              ((QMutexLocker<QBasicMutex> *)
               CONCAT17(in_stack_ffffffffffffffa7,
                        CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
               (QBasicMutex *)in_stack_ffffffffffffff98);
    local_19 = QObjectPrivate::isSignalConnected(this_00,uVar3,(bool)in_stack_ffffffffffffffc3);
    QMutexLocker<QBasicMutex>::~QMutexLocker
              ((QMutexLocker<QBasicMutex> *)
               CONCAT17(local_19,CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool QObject::isSignalConnected(const QMetaMethod &signal) const
{
    Q_D(const QObject);
    if (!signal.mobj)
        return false;

    Q_ASSERT_X(signal.mobj->cast(this) && signal.methodType() == QMetaMethod::Signal,
               "QObject::isSignalConnected" , "the parameter must be a signal member of the object");
    uint signalIndex = signal.relativeMethodIndex();

    if (signal.data.flags() & MethodCloned)
        signalIndex = QMetaObjectPrivate::originalClone(signal.mobj, signalIndex);

    signalIndex += QMetaObjectPrivate::signalOffset(signal.mobj);

    QMutexLocker locker(signalSlotLock(this));
    return d->isSignalConnected(signalIndex, true);
}